

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enemy.cpp
# Opt level: O0

void __thiscall
Enemy::update(Enemy *this,int width,Paddle *paddle,vector<Brick,_std::allocator<Brick>_> *bricks,
             Character *character,int currentTimeInMillis,bool winOrLose)

{
  float *pfVar1;
  bool bVar2;
  reference other;
  uint uVar3;
  float fVar4;
  float fVar5;
  vec2 vVar6;
  float fStack_a4;
  Brick *brick;
  iterator __end1;
  iterator __begin1;
  vector<Brick,_std::allocator<Brick>_> *__range1;
  vec<2,_float,_(glm::qualifier)0> local_78;
  vec<2,_float,_(glm::qualifier)0> local_70;
  vec<2,_float,_(glm::qualifier)0> local_68;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_60;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_58;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_50;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_48;
  vec<2,_float,_(glm::qualifier)0> local_40;
  vec2 acceleration;
  bool winOrLose_local;
  int currentTimeInMillis_local;
  Character *character_local;
  vector<Brick,_std::allocator<Brick>_> *bricks_local;
  Paddle *paddle_local;
  int width_local;
  Enemy *this_local;
  
  acceleration.field_0._3_1_ = winOrLose;
  if (this->state != DEAD) {
    acceleration.field_0.field_0.y = (float)currentTimeInMillis;
    if (((this->super_AABB).center.field_0.field_0.x <= 32.0) ||
       ((float)width - 32.0 <= (this->super_AABB).center.field_0.field_0.x)) {
      glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_40,0.0,0.0);
    }
    else {
      glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_40,0.0,0.2);
    }
    glm::vec<2,float,(glm::qualifier)0>::operator+=
              ((vec<2,float,(glm::qualifier)0> *)&this->velocity,&local_40);
    fVar4 = (this->velocity).field_0.field_0.x;
    glm::vec<2,_float,_(glm::qualifier)0>::vec
              ((vec<2,_float,_(glm::qualifier)0> *)&local_48.field_0,1.0,4.0);
    if (-local_48.field_0.x <= fVar4) {
      fVar4 = (this->velocity).field_0.field_0.x;
      glm::vec<2,_float,_(glm::qualifier)0>::vec
                ((vec<2,_float,_(glm::qualifier)0> *)&local_58.field_0,1.0,4.0);
      if (local_58.field_0.x < fVar4) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&local_60.field_0,1.0,4.0);
        (this->velocity).field_0.field_0.x = local_60.field_0.x;
      }
    }
    else {
      glm::vec<2,_float,_(glm::qualifier)0>::vec
                ((vec<2,_float,_(glm::qualifier)0> *)&local_50.field_0,1.0,4.0);
      (this->velocity).field_0.field_0.x = -local_50.field_0.x;
    }
    fVar4 = (this->velocity).field_0.field_0.y;
    glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_68,1.0,4.0);
    if (-local_68.field_0.field_0.y <= fVar4) {
      fVar4 = (this->velocity).field_0.field_0.y;
      glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_78,1.0,4.0);
      if (local_78.field_0.field_0.y < fVar4) {
        glm::vec<2,_float,_(glm::qualifier)0>::vec
                  ((vec<2,_float,_(glm::qualifier)0> *)&__range1,1.0,4.0);
        (this->velocity).field_0.field_0.y = __range1._4_4_;
      }
    }
    else {
      glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_70,1.0,4.0);
      (this->velocity).field_0.field_0.y = -local_70.field_0.field_0.y;
    }
    glm::vec<2,float,(glm::qualifier)0>::operator+=
              ((vec<2,float,(glm::qualifier)0> *)this,&this->velocity);
    fVar4 = AABB::getTop(&this->super_AABB);
    pfVar1 = &(this->startPos).field_0.field_0.y;
    if (*pfVar1 <= fVar4 && fVar4 != *pfVar1) {
      fVar4 = AABB::getLeft(&this->super_AABB);
      if (32.0 <= fVar4) {
        fVar4 = AABB::getRight(&this->super_AABB);
        if ((float)width - 32.0 < fVar4) {
          (this->super_AABB).center.field_0.field_0.x =
               (((float)width - 32.0) - (this->super_AABB).halfDimension.field_0.field_0.x) - 1.0;
          (this->velocity).field_0.field_0.x = (this->velocity).field_0.field_0.x * -1.0;
        }
      }
      else {
        (this->super_AABB).center.field_0.field_0.x =
             (this->super_AABB).halfDimension.field_0.field_0.x + 32.0 + 1.0;
        (this->velocity).field_0.field_0.x = (this->velocity).field_0.field_0.x * -1.0;
      }
    }
    __end1 = std::vector<Brick,_std::allocator<Brick>_>::begin(bricks);
    brick = (Brick *)std::vector<Brick,_std::allocator<Brick>_>::end(bricks);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Brick_*,_std::vector<Brick,_std::allocator<Brick>_>_>
                                       *)&brick), bVar2) {
      other = __gnu_cxx::__normal_iterator<Brick_*,_std::vector<Brick,_std::allocator<Brick>_>_>::
              operator*(&__end1);
      bVar2 = AABB::intersectsAABB(&this->super_AABB,&other->super_AABB);
      if (bVar2) {
        fVar4 = AABB::getBottom(&this->super_AABB);
        pfVar1 = &(other->super_AABB).center.field_0.field_0.y;
        if (fVar4 < *pfVar1 || fVar4 == *pfVar1) {
          (this->super_AABB).center.field_0.field_0.y =
               ((other->super_AABB).center.field_0.field_0.y -
               (other->super_AABB).halfDimension.field_0.field_0.y) -
               (this->super_AABB).halfDimension.field_0.field_0.y;
          (this->velocity).field_0.field_0.y = 0.0;
        }
        else {
          if (0.0 < (this->velocity).field_0.field_0.x) {
            fVar4 = AABB::getRight(&this->super_AABB);
            fVar5 = AABB::getLeft(&other->super_AABB);
            if (fVar5 < fVar4) {
              fVar4 = AABB::getLeft(&other->super_AABB);
              (this->super_AABB).center.field_0.field_0.x =
                   (fVar4 - (this->super_AABB).halfDimension.field_0.field_0.x) - 1.0;
              (this->velocity).field_0.field_0.x = (this->velocity).field_0.field_0.x * -1.0;
              goto LAB_0016db03;
            }
          }
          if ((this->velocity).field_0.field_0.x <= 0.0 && (this->velocity).field_0.field_0.x != 0.0
             ) {
            fVar4 = AABB::getLeft(&this->super_AABB);
            fVar5 = AABB::getRight(&other->super_AABB);
            if (fVar4 < fVar5) {
              fVar4 = AABB::getRight(&other->super_AABB);
              (this->super_AABB).center.field_0.field_0.x =
                   fVar4 + (this->super_AABB).halfDimension.field_0.field_0.x + 1.0;
              (this->velocity).field_0.field_0.x = (this->velocity).field_0.field_0.x * -1.0;
            }
          }
        }
      }
LAB_0016db03:
      __gnu_cxx::__normal_iterator<Brick_*,_std::vector<Brick,_std::allocator<Brick>_>_>::operator++
                (&__end1);
    }
    if (((acceleration.field_0._3_1_ & 1) == 0) &&
       (bVar2 = AABB::intersectsAABB(&this->super_AABB,&character->super_AABB), bVar2)) {
      vVar6 = Character::getVelocity(character);
      fStack_a4 = vVar6.field_0._4_4_;
      bVar2 = false;
      if (0.0 < fStack_a4) {
        fVar4 = AABB::getBottom(&character->super_AABB);
        bVar2 = fVar4 < (this->super_AABB).center.field_0.field_0.y;
      }
      if (bVar2) {
        this->state = DEAD;
        this->timeOfDeathInMillis = (int)acceleration.field_0.field_0.y;
        (this->velocity).field_0.field_0.x = 0.0;
        Character::bounce(character);
      }
      else {
        bVar2 = Character::isInvincible(character);
        if (!bVar2) {
          uVar3 = -(uint)((character->super_AABB).center.field_0.field_0.x <
                         (this->super_AABB).center.field_0.field_0.x);
          Character::dieByEnemy
                    (character,(int)acceleration.field_0.field_0.y,
                     (float)(~uVar3 & 0x3f800000 | uVar3 & 0xbf800000));
        }
      }
    }
  }
  return;
}

Assistant:

void Enemy::update(int width, Paddle& paddle, std::vector<Brick>& bricks, Character& character, int currentTimeInMillis, bool winOrLose) {
    if (state == DEAD) {
        return;
    }
    glm::vec2 acceleration = (center.x > BRICK_WIDTH && center.x < (width - BRICK_WIDTH)) ? GRAVITY : glm::vec2(0.0f, 0.0f);
    velocity += acceleration;
    if (velocity.x < -ENEMY_MAX_VELOCITY.x) {
        velocity.x = -ENEMY_MAX_VELOCITY.x;
    } else if (velocity.x > ENEMY_MAX_VELOCITY.x) {
        velocity.x = ENEMY_MAX_VELOCITY.x;
    }
    if (velocity.y < -ENEMY_MAX_VELOCITY.y) {
        velocity.y = -ENEMY_MAX_VELOCITY.y;
    } else if (velocity.y > ENEMY_MAX_VELOCITY.y) {
        velocity.y = ENEMY_MAX_VELOCITY.y;
    }
    center += velocity;
    if (getTop() > startPos.y) {
        if (getLeft() < BRICK_WIDTH) {
            center.x = BRICK_WIDTH + halfDimension.x + 1;
            velocity.x *= -1.0f;
        } else if (getRight() > width - BRICK_WIDTH) {
            center.x = width - BRICK_WIDTH - halfDimension.x - 1;
            velocity.x *= -1.0f;
        }
    }
    for (Brick& brick : bricks) {
        if (intersectsAABB(brick)) {
            if (getBottom() > brick.center.y) {
                if (velocity.x > 0.0f && getRight() > brick.getLeft()) {
                    center.x = brick.getLeft() - halfDimension.x - 1;
                    velocity.x *= -1.0f;
                } else if (velocity.x < 0.0f && getLeft() < brick.getRight()) {
                    center.x = brick.getRight() + halfDimension.x + 1;
                    velocity.x *= -1.0f;
                }
            } else {
                center.y = brick.center.y - brick.halfDimension.y - halfDimension.y;
                velocity.y = 0.0f;
            }
        }
    }
    if (!winOrLose) {
        if (intersectsAABB(character)) {
            if (character.getVelocity().y > 0.0 && character.getBottom() < center.y) {
                state = DEAD;
                timeOfDeathInMillis = currentTimeInMillis;
                velocity.x = 0.0f;
                character.bounce();
            } else if (!character.isInvincible()) {
                character.dieByEnemy(currentTimeInMillis, character.center.x < center.x ? -1.0f : 1.0f);
            }
        }
    }
}